

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVector<llvm::DILineInfo,_4U>::~SmallVector(SmallVector<llvm::DILineInfo,_4U> *this)

{
  iterator S;
  iterator E;
  SmallVector<llvm::DILineInfo,_4U> *this_local;
  
  S = SmallVectorTemplateCommon<llvm::DILineInfo,_void>::begin
                ((SmallVectorTemplateCommon<llvm::DILineInfo,_void> *)this);
  E = SmallVectorTemplateCommon<llvm::DILineInfo,_void>::end
                ((SmallVectorTemplateCommon<llvm::DILineInfo,_void> *)this);
  SmallVectorTemplateBase<llvm::DILineInfo,_false>::destroy_range(S,E);
  SmallVectorImpl<llvm::DILineInfo>::~SmallVectorImpl
            (&this->super_SmallVectorImpl<llvm::DILineInfo>);
  return;
}

Assistant:

~SmallVector() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());
  }